

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

void __thiscall
EthBasePort::make_qwrite_packet
          (EthBasePort *this,quadlet_t *packet,nodeid_t node,nodeaddr_t addr,quadlet_t data,uint tl)

{
  long lVar1;
  uint uVar2;
  
  uVar2 = (uint)node << 0x10 | 0xffc00000;
  *packet = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (tl & 0x3f) << 0x12;
  uVar2 = (uint)((addr & 0xffff00ff0000) >> 0x20);
  packet[1] = (uVar2 & 0xff00) << 8 | 0xd0ff | uVar2 << 0x18;
  uVar2 = (uint)addr;
  packet[2] = uVar2 >> 0x18 | (uint)(addr & 0xffff00ff0000) >> 8 | (uVar2 & 0xff00) << 8 |
              uVar2 << 0x18;
  packet[3] = data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
  uVar2 = 0xffffffff;
  lVar1 = 0;
  do {
    uVar2 = uVar2 >> 8 ^ crc32_tab[(byte)(""[*(byte *)((long)packet + lVar1)] ^ (byte)uVar2)];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  uVar2 = ~uVar2;
  packet[4] = (uint)""[uVar2 & 0xff] | ((uint)""[uVar2 >> 8 & 0xff] << 0x10) >> 8 |
              (uint)""[uVar2 >> 0x10 & 0xff] << 0x10 | (uint)""[uVar2 >> 0x18] << 0x18;
  return;
}

Assistant:

void EthBasePort::make_1394_header(quadlet_t *packet, nodeid_t node, nodeaddr_t addr, unsigned int tcode,
                                   unsigned int tl)
{
    // FFC0 replicates the base node ID when using FireWire on PC. This is followed by a transaction
    // label (arbitrary value that is returned by any resulting FireWire packets) and the transaction code.
    unsigned char fw_pri = 0;
    packet[0] = bswap_32((0xFFC0 | (node&FW_NODE_MASK)) << 16 | (tl & 0x003F) << 10 | (tcode & 0x000F) << 4 | (fw_pri & 0x000F));
    // FFD0 is used as source ID (most significant 16 bits); this sets source node to 0x10 (16).
    // Previously, FFFF was used, which set the source node to 0x3f (63), which is the broadcast address.
    // This is followed by the destination address, which is 48-bits long
    packet[1] = bswap_32((0xFFD0 << 16) | ((addr & 0x0000FFFF00000000) >> 32));
    packet[2] = bswap_32(addr&0xFFFFFFFF);
}